

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O3

int testDatumArrayConversions(void)

{
  string *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  VRCORETYPE_ID VVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float extraout_XMM0_Da;
  VRIntArray e;
  string b;
  VRFloatArray g;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  c;
  VRDatumInt d;
  VRDatumString a;
  VRDatumFloat f;
  VRIntArray local_1f0;
  long *local_1d8 [2];
  long local_1c8 [2];
  VRString local_1b8;
  VRFloatArray local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1> local_168;
  VRDatumString local_100;
  VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> local_98;
  
  iVar10 = 0;
  do {
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"this is a string","");
    MinVR::VRDatumString::VRDatumString(&local_100,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    psVar1 = &local_168.super_VRDatum.description;
    local_168.super_VRDatum._vptr_VRDatum = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,
               local_100.
               super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
               .super_VRDatum.description._M_dataplus._M_p,
               local_100.
               super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
               .super_VRDatum.description._M_dataplus._M_p +
               local_100.
               super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
               .super_VRDatum.description._M_string_length);
    iVar6 = std::__cxx11::string::compare((char *)&local_168);
    if ((string *)local_168.super_VRDatum._vptr_VRDatum != psVar1) {
      operator_delete(local_168.super_VRDatum._vptr_VRDatum,
                      (ulong)(local_168.super_VRDatum.description._M_dataplus._M_p + 1));
    }
    (*local_100.
      super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
      .super_VRDatum._vptr_VRDatum[2])(local_1d8,&local_100);
    (*local_100.
      super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
      .super_VRDatum._vptr_VRDatum[0xf])(&local_180,&local_100);
    iVar7 = std::__cxx11::string::compare
                      ((string *)
                       local_180.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    VVar5 = local_100.
            super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
            .super_VRDatum.type;
    local_168.super_VRDatum._vptr_VRDatum = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,
               local_100.
               super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
               .value.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next[1]._M_next,
               (long)&(local_100.
                       super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
                       .value.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev)->_M_next +
               (long)local_100.
                     super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
                     .value.
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next[1]._M_next);
    iVar8 = std::__cxx11::string::compare((char *)&local_168);
    if ((string *)local_168.super_VRDatum._vptr_VRDatum != psVar1) {
      operator_delete(local_168.super_VRDatum._vptr_VRDatum,
                      (ulong)(local_168.super_VRDatum.description._M_dataplus._M_p + 1));
    }
    MinVR::VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>::VRDatumSpecialized(&local_168,0x25);
    local_168.super_VRDatum._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_0014a8f8;
    MinVR::VRDatumInt::getValueIntArray(&local_1f0,(VRDatumInt *)&local_168);
    iVar2 = *local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    iVar9 = (*local_168.super_VRDatum._vptr_VRDatum[6])(&local_168);
    MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::VRDatumSpecialized
              (&local_98,3.1415925);
    local_98.super_VRDatum._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_0014a9b8;
    MinVR::VRDatumFloat::getValueFloatArray(&local_198,(VRDatumFloat *)&local_98);
    (*local_98.super_VRDatum._vptr_VRDatum[8])(&local_98);
    *local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_start = extraout_XMM0_Da;
    operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    local_98.super_VRDatum._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_0014a3b8;
    p_Var4 = local_98.value.super__List_base<float,_std::allocator<float>_>._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var4 != (_List_node_base *)&local_98.value) {
      p_Var3 = p_Var4->_M_next;
      operator_delete(p_Var4,0x18);
      p_Var4 = p_Var3;
    }
    MinVR::VRDatum::~VRDatum(&local_98.super_VRDatum);
    if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_168.super_VRDatum._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_0014a200;
    p_Var4 = local_168.value.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var4 != (_List_node_base *)&local_168.value) {
      p_Var3 = p_Var4->_M_next;
      operator_delete(p_Var4,0x18);
      p_Var4 = p_Var3;
    }
    MinVR::VRDatum::~VRDatum(&local_168.super_VRDatum);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_180);
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0],local_1c8[0] + 1);
    }
    local_100.
    super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    .super_VRDatum._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_0014a550;
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_100.
                super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
                .value.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    MinVR::VRDatum::~VRDatum((VRDatum *)&local_100);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 10);
  return (uint)(iVar2 != iVar9) + iVar7 + iVar6 + iVar8 + (uint)(VVar5 != VRCORETYPE_STRING) +
         (uint)(extraout_XMM0_Da == 0.0);
}

Assistant:

int testDatumArrayConversions() {

  int out = 0;

  LOOP {

    MinVR::VRDatumString a = MinVR::VRDatumString(std::string("this is a string"));

    out = a.getDescription().compare("string");

    std::string b = a.getValue();

    std::vector<std::string> c = a.getValue();

    out += c[0].compare(b);

    out += (a.getType() == MinVR::VRCORETYPE_STRING) ? 0 : 1;

    out += a.getValueString().compare("this is a string");

    MinVR::VRDatumInt d = MinVR::VRDatumInt(37);

    MinVR::VRIntArray e = d.getValue();

    out += (e[0] == (MinVR::VRInt)d.getValue()) ? 0 : 1;

    MinVR::VRDatumFloat f = MinVR::VRDatumFloat(3.1415926f);

    MinVR::VRFloatArray g = f.getValue();

    out += (g[0] = (MinVR::VRFloat)f.getValue()) ? 0 : 1;

  }